

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall dg::vr::StructureAnalyzer::categorizeEdges(StructureAnalyzer *this)

{
  long lVar1;
  long lVar2;
  VREdge *pVVar3;
  VRLocation *pVVar4;
  pointer puVar5;
  __uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> _Var6;
  VRLocation *loc;
  char cVar7;
  bool bVar8;
  Function *f;
  uint i;
  ulong uVar9;
  long *plVar10;
  SimpleDFS it;
  SimpleDFS local_e0;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> local_88;
  
  lVar1 = *(long *)this;
  plVar10 = (long *)(lVar1 + 0x20);
  while (lVar2 = *plVar10, lVar2 != lVar1 + 0x18) {
    f = (Function *)(lVar2 + -0x38);
    if (lVar2 == 0) {
      f = (Function *)0x0;
    }
    cVar7 = llvm::GlobalValue::isDeclaration();
    if (cVar7 == '\0') {
      VRCodeGraph::dfs_begin(&local_e0,*(VRCodeGraph **)(this + 8),f);
      while( true ) {
        VRCodeGraph::dfs_end();
        bVar8 = operator!=(&local_e0,&local_88);
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::~DFSIt(&local_88);
        if (!bVar8) break;
        pVVar3 = local_e0.stack.
                 super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                 super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
                 super__Tuple_impl<2UL,_dg::vr::VREdge_*>.
                 super__Head_base<2UL,_dg::vr::VREdge_*,_false>._M_head_impl;
        pVVar4 = local_e0.stack.
                 super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                 super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
        if (pVVar3 != (VREdge *)0x0) {
          pVVar3->type = TREE;
        }
        for (uVar9 = 0;
            puVar5 = (pVVar4->successors).
                     super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar9 < ((ulong)((long)(pVVar4->successors).
                                   super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3 &
                    0xffffffff); uVar9 = uVar9 + 1) {
          _Var6._M_t.super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
          super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl =
               puVar5[uVar9]._M_t.
               super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
          loc = *(VRLocation **)
                 ((long)_Var6._M_t.
                        super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>
                        .super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 8);
          if (loc == (VRLocation *)0x0) {
            *(undefined4 *)
             ((long)_Var6._M_t.
                    super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
                    super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = 0;
          }
          else {
            bVar8 = VRCodeGraph::SimpleVisit::wasVisited(&local_e0.super_SimpleVisit,loc);
            if (bVar8) {
              bVar8 = VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::onStack(&local_e0,loc);
              if (bVar8) {
                *(undefined4 *)
                 ((long)_Var6._M_t.
                        super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>
                        .super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = 1;
              }
              else {
                *(undefined4 *)
                 ((long)_Var6._M_t.
                        super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>
                        .super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = 2;
              }
            }
          }
        }
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++(&local_e0);
      }
      VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::~DFSIt(&local_e0);
    }
    plVar10 = (long *)(lVar2 + 8);
  }
  VRCodeGraph::hasCategorizedEdges(*(VRCodeGraph **)(this + 8));
  return;
}

Assistant:

void StructureAnalyzer::categorizeEdges() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.dfs_begin(function); it != codeGraph.dfs_end();
             ++it) {
            VRLocation &current = *it;
            VREdge *predEdge = it.getEdge();

            if (predEdge)
                predEdge->type = EdgeType::TREE;

            for (unsigned i = 0; i < current.succsSize(); ++i) {
                VREdge *succEdge = current.getSuccEdge(i);
                VRLocation *successor = succEdge->target;

                if (!successor)
                    succEdge->type = EdgeType::TREE;
                else if (it.wasVisited(successor)) {
                    if (it.onStack(successor))
                        succEdge->type = EdgeType::BACK;
                    else
                        succEdge->type = EdgeType::FORWARD;
                }
            }
        }
    }

    codeGraph.hasCategorizedEdges();
}